

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

void __thiscall SoftHSM::~SoftHSM(SoftHSM *this)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  this->_vptr_SoftHSM = (_func_int **)&PTR__SoftHSM_0019cf58;
  if (this->handleManager != (HandleManager *)0x0) {
    (*this->handleManager->_vptr_HandleManager[1])();
  }
  this->handleManager = (HandleManager *)0x0;
  if (this->sessionManager != (SessionManager *)0x0) {
    (*this->sessionManager->_vptr_SessionManager[1])();
  }
  this->sessionManager = (SessionManager *)0x0;
  if (this->slotManager != (SlotManager *)0x0) {
    (*this->slotManager->_vptr_SlotManager[1])();
  }
  this->slotManager = (SlotManager *)0x0;
  if (this->objectStore != (ObjectStore *)0x0) {
    (*this->objectStore->_vptr_ObjectStore[1])();
  }
  this->objectStore = (ObjectStore *)0x0;
  if (this->sessionObjectStore != (SessionObjectStore *)0x0) {
    (*this->sessionObjectStore->_vptr_SessionObjectStore[1])();
  }
  this->sessionObjectStore = (SessionObjectStore *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&(this->mechanisms_table)._M_t);
  plVar1 = &this->supportedMechanisms;
  p_Var3 = (this->supportedMechanisms).
           super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  (this->supportedMechanisms).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->supportedMechanisms).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->supportedMechanisms).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl._M_node._M_size = 0;
  this->isInitialised = false;
  resetMutexFactoryCallbacks();
  p_Var3 = (plVar1->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mechanisms_table)._M_t);
  return;
}

Assistant:

SoftHSM::~SoftHSM()
{
	if (handleManager != NULL) delete handleManager;
	handleManager = NULL;
	if (sessionManager != NULL) delete sessionManager;
	sessionManager = NULL;
	if (slotManager != NULL) delete slotManager;
	slotManager = NULL;
	if (objectStore != NULL) delete objectStore;
	objectStore = NULL;
	if (sessionObjectStore != NULL) delete sessionObjectStore;
	sessionObjectStore = NULL;

	mechanisms_table.clear();
	supportedMechanisms.clear();

	isInitialised = false;

	resetMutexFactoryCallbacks();
}